

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_wrapper.cpp
# Opt level: O0

ssize_t __thiscall
YAML::ostream_wrapper::write(ostream_wrapper *this,int __fd,void *__buf,size_t __n)

{
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *this_00;
  undefined4 in_register_00000034;
  size_t i;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  long __n_00;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_ffffffffffffffb8;
  void *pvVar1;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  unsigned_long local_28;
  size_type local_20;
  void *local_18;
  long local_10;
  ostream_wrapper *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_18 = __buf;
  local_8 = this;
  if (this->m_pStream == (ostream *)0x0) {
    local_20 = std::vector<char,_std::allocator<char>_>::size(&this->m_buffer);
    local_28 = (long)local_18 + this->m_pos + 1;
    std::max<unsigned_long>(&local_20,&local_28);
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8._M_current);
    this_00 = (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
              (local_10 + (long)local_18);
    __n_00 = local_10;
    std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffff98);
    __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator+
              (this_00,__n_00);
    std::
    copy<char_const*,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((char *)this,(char *)this_00,in_stack_ffffffffffffffb8);
  }
  else {
    std::ostream::write((char *)this->m_pStream,local_10);
  }
  for (pvVar1 = (void *)0x0; pvVar1 < local_18; pvVar1 = (void *)((long)pvVar1 + 1)) {
    update_pos(this,*(char *)(local_10 + (long)pvVar1));
  }
  return (ssize_t)pvVar1;
}

Assistant:

void ostream_wrapper::write(const char* str, std::size_t size) {
  if (m_pStream) {
    m_pStream->write(str, size);
  } else {
    m_buffer.resize(std::max(m_buffer.size(), m_pos + size + 1));
    std::copy(str, str + size, m_buffer.begin() + m_pos);
  }

  for (std::size_t i = 0; i < size; i++) {
    update_pos(str[i]);
  }
}